

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HostCoordinator.hpp
# Opt level: O0

view_type * __thiscall
memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<16UL>_>_>::
allocate(view_type *__return_storage_ptr__,
        HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<16UL>_>_> *this,
        size_type n)

{
  pointer local_60;
  pointer ptr;
  size_type sStack_20;
  template_rebind<value_type> allocator;
  size_type n_local;
  HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<16UL>_>_> *this_local;
  
  sStack_20 = n;
  Allocator<float,_memory::impl::AlignedPolicy<16UL>_>::Allocator
            ((Allocator<float,_memory::impl::AlignedPolicy<16UL>_> *)((long)&ptr + 7));
  if (sStack_20 == 0) {
    local_60 = (pointer)0x0;
  }
  else {
    local_60 = Allocator<float,_memory::impl::AlignedPolicy<16UL>_>::allocate
                         ((Allocator<float,_memory::impl::AlignedPolicy<16UL>_> *)((long)&ptr + 7),
                          sStack_20,(const_pointer)0x0);
  }
  ArrayViewImpl<memory::ArrayReference<float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<16UL>_>_>_>,_float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<16UL>_>_>_>
  ::ArrayViewImpl(__return_storage_ptr__,local_60,sStack_20);
  Allocator<float,_memory::impl::AlignedPolicy<16UL>_>::~Allocator
            ((Allocator<float,_memory::impl::AlignedPolicy<16UL>_> *)((long)&ptr + 7));
  return __return_storage_ptr__;
}

Assistant:

view_type allocate(size_type n) {
        typename Allocator::template rebind<value_type> allocator;

        pointer ptr = n>0 ? allocator.allocate(n) : nullptr;

        #ifdef VERBOSE
        std::cerr << util::type_printer<HostCoordinator>::print()
                  << "::" + util::blue("alocate") << "(" << n
                  << " [" << n*sizeof(value_type) << " bytes]) @ " << ptr
                  << std::endl;
        #endif

        return view_type(ptr, n);
    }